

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O0

base_learner * lrqfa_setup(options_i *options,vw *all)

{
  char cVar1;
  vw *pvVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  pointer pLVar6;
  char *__nptr;
  reference pcVar7;
  single_learner *base;
  learner<LRQFAstate,_example> *base_00;
  vw *in_RSI;
  long *in_RDI;
  learner<LRQFAstate,_example> *l;
  char i;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  int fd_id;
  size_t last_index;
  string lrqopt;
  free_ptr<LRQFAstate> lrq;
  option_group_definition new_options;
  string lrqfa;
  string *in_stack_fffffffffffffd28;
  vw *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  _func_void_LRQFAstate_ptr_learner<char,_example>_ptr_example_ptr *predict;
  _func_void_LRQFAstate_ptr_learner<char,_example>_ptr_example_ptr *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd50;
  uint32_t uVar8;
  undefined6 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  option_group_definition *in_stack_fffffffffffffd80;
  string *arg;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  string *local_228;
  int local_21c;
  string local_218 [32];
  undefined8 local_1f8;
  string local_1f0 [32];
  undefined1 local_1d0 [16];
  undefined4 local_1c0;
  allocator local_1b9;
  string local_1b8 [39];
  undefined1 local_191 [40];
  allocator local_169;
  string local_168 [88];
  learner<char,_char> *in_stack_fffffffffffffef0;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [32];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Low Rank Quadratics FA",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"lrqfa",&local_169);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(local_168 + 0x20),true);
  arg = (string *)local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_191 + 1),"use low rank quadratic features with field aware weights",
             (allocator *)arg);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffffd80,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffd7f,
                         CONCAT16(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd78)));
  std::__cxx11::string::~string((string *)(local_191 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_191);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  (**(code **)*local_10)(local_10,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"lrqfa",&local_1b9);
  bVar3 = (**(code **)(*local_10 + 8))(local_10,local_1b8);
  bVar3 = bVar3 ^ 0xff;
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  if ((bVar3 & 1) == 0) {
    scoped_calloc_or_throw<LRQFAstate>();
    pvVar2 = local_18;
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed794);
    pLVar6->all = pvVar2;
    spoof_hex_encoded_namespaces(arg);
    local_1f8 = std::__cxx11::string::find_last_not_of((char *)local_1f0,0x3fb386);
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed7e8);
    std::__cxx11::string::substr((ulong)&pLVar6->field_name,(ulong)local_1f0);
    std::__cxx11::string::substr((ulong)local_218,(ulong)local_1f0);
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar5 = atoi(__nptr);
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed859);
    pLVar6->k = iVar5;
    std::__cxx11::string::~string(local_218);
    local_21c = 0;
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed885);
    local_228 = &pLVar6->field_name;
    local_230._M_current = (char *)std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar4) break;
      pcVar7 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_230);
      iVar5 = local_21c;
      cVar1 = *pcVar7;
      local_21c = local_21c + 1;
      pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                         ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed911);
      pLVar6->field_id[(int)cVar1] = iVar5;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_230);
    }
    uVar8 = local_18->wpp;
    pLVar6 = std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
                       ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed991);
    local_18->wpp = uVar8 * (pLVar6->k + 1);
    setup_base((options_i *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    base = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffef0);
    predict = (_func_void_LRQFAstate_ptr_learner<char,_example>_ptr_example_ptr *)local_1d0;
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
              ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2ed9ea);
    in_stack_fffffffffffffd30 = (vw *)std::__cxx11::string::size();
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::operator->
              ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)0x2eda05);
    base_00 = LEARNER::init_learner<LRQFAstate,example,LEARNER::learner<char,example>>
                        ((free_ptr<LRQFAstate> *)CONCAT44(uVar8,in_stack_fffffffffffffd50),base,
                         in_stack_fffffffffffffd40,predict,(size_t)in_stack_fffffffffffffd30);
    local_8 = LEARNER::make_base<LRQFAstate,example>(base_00);
    local_1c0 = 1;
    std::__cxx11::string::~string(local_1f0);
    std::unique_ptr<LRQFAstate,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<LRQFAstate,_void_(*)(void_*)> *)base_00);
  }
  else {
    local_8 = (base_learner *)0x0;
    local_1c0 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

LEARNER::base_learner* lrqfa_setup(options_i& options, vw& all)
{
  std::string lrqfa;
  option_group_definition new_options("Low Rank Quadratics FA");
  new_options.add(make_option("lrqfa", lrqfa).keep().help("use low rank quadratic features with field aware weights"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrqfa"))
    return nullptr;

  auto lrq = scoped_calloc_or_throw<LRQFAstate>();
  lrq->all = &all;

  string lrqopt = spoof_hex_encoded_namespaces(lrqfa);
  size_t last_index = lrqopt.find_last_not_of("0123456789");
  new (&lrq->field_name) string(lrqopt.substr(0, last_index + 1));  // make sure there is no duplicates
  lrq->k = atoi(lrqopt.substr(last_index + 1).c_str());

  int fd_id = 0;
  for (char i : lrq->field_name) lrq->field_id[(int)i] = fd_id++;

  all.wpp = all.wpp * (uint64_t)(1 + lrq->k);
  learner<LRQFAstate, example>& l = init_learner(lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>,
      predict_or_learn<false>, 1 + lrq->field_name.size() * lrq->k);

  return make_base(l);
}